

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O2

void __thiscall
sglr::GLContext::deleteFramebuffers(GLContext *this,int numFramebuffers,deUint32 *framebuffers)

{
  long lVar1;
  ulong uVar2;
  
  lVar1 = 0;
  uVar2 = 0;
  if (0 < numFramebuffers) {
    uVar2 = (ulong)(uint)numFramebuffers;
  }
  for (; uVar2 * 4 != lVar1; lVar1 = lVar1 + 4) {
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::erase(&(this->m_allocatedFbos)._M_t,(key_type_conflict *)((long)framebuffers + lVar1));
  }
  glu::CallLogWrapper::glDeleteFramebuffers(this->m_wrapper,numFramebuffers,framebuffers);
  return;
}

Assistant:

void GLContext::deleteFramebuffers (int numFramebuffers, const deUint32* framebuffers)
{
	for (int i = 0; i < numFramebuffers; i++)
		m_allocatedFbos.erase(framebuffers[i]);
	m_wrapper->glDeleteFramebuffers(numFramebuffers, framebuffers);
}